

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O0

char * lafe_line_reader_next(lafe_line_reader *lr)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  uint *puVar7;
  long *in_RDI;
  char *p;
  char *line_start;
  size_t new_buff_size;
  size_t bytes_read;
  size_t bytes_wanted;
  char *local_8;
  
  do {
    while ((ulong)in_RDI[4] < (ulong)in_RDI[2]) {
      pcVar1 = (char *)in_RDI[3];
      lVar2 = in_RDI[4];
      in_RDI[4] = lVar2 + 1;
      in_RDI[3] = lVar2 + 1;
      lafe_line_reader_find_eol((lafe_line_reader *)0x1169f1);
      if ((int)in_RDI[8] != 0) {
        return pcVar1;
      }
      if (*pcVar1 != '\0') {
        return pcVar1;
      }
    }
    if (*in_RDI == 0) {
      if (in_RDI[3] == in_RDI[2]) {
        local_8 = (char *)0x0;
      }
      else {
        local_8 = (char *)in_RDI[3];
        in_RDI[3] = in_RDI[2];
      }
      return local_8;
    }
    if ((ulong)in_RDI[1] < (ulong)in_RDI[3]) {
      memmove((void *)in_RDI[1],(void *)in_RDI[3],in_RDI[2] - in_RDI[3]);
      in_RDI[2] = in_RDI[2] - (in_RDI[3] - in_RDI[1]);
      in_RDI[4] = in_RDI[4] - (in_RDI[3] - in_RDI[1]);
      in_RDI[3] = in_RDI[1];
    }
    else {
      uVar4 = in_RDI[7] * 2;
      if (uVar4 <= (ulong)in_RDI[7]) {
        lafe_errc(1,0xc,"Line too long in %s",in_RDI[6]);
      }
      in_RDI[7] = uVar4;
      pvVar5 = realloc((void *)in_RDI[1],uVar4 + 1);
      if (pvVar5 == (void *)0x0) {
        lafe_errc(1,0xc,"Line too long in %s",in_RDI[6]);
      }
      in_RDI[2] = (long)pvVar5 + (in_RDI[2] - in_RDI[1]);
      in_RDI[4] = (long)pvVar5 + (in_RDI[4] - in_RDI[1]);
      in_RDI[1] = (long)pvVar5;
      in_RDI[3] = (long)pvVar5;
    }
    sVar6 = fread((void *)in_RDI[2],1,(in_RDI[1] + in_RDI[7]) - in_RDI[2],(FILE *)*in_RDI);
    in_RDI[2] = sVar6 + in_RDI[2];
    *(undefined1 *)in_RDI[2] = 0;
    lafe_line_reader_find_eol((lafe_line_reader *)0x116c88);
    iVar3 = ferror((FILE *)*in_RDI);
    if (iVar3 != 0) {
      puVar7 = (uint *)__errno_location();
      lafe_errc(1,(int)(ulong)*puVar7,"Can\'t read %s",in_RDI[6]);
    }
    iVar3 = feof((FILE *)*in_RDI);
    if (iVar3 != 0) {
      if (*in_RDI != _stdin) {
        fclose((FILE *)*in_RDI);
      }
      *in_RDI = 0;
    }
  } while( true );
}

Assistant:

const char *
lafe_line_reader_next(struct lafe_line_reader *lr)
{
	size_t bytes_wanted, bytes_read, new_buff_size;
	char *line_start, *p;

	for (;;) {
		/* If there's a line in the buffer, return it immediately. */
		while (lr->line_end < lr->buff_end) {
			line_start = lr->line_start;
			lr->line_start = ++lr->line_end;
			lafe_line_reader_find_eol(lr);

			if (lr->nullSeparator || line_start[0] != '\0')
				return (line_start);
		}

		/* If we're at end-of-file, process the final data. */
		if (lr->f == NULL) {
			if (lr->line_start == lr->buff_end)
				return (NULL); /* No more text */
			line_start = lr->line_start;
			lr->line_start = lr->buff_end;
			return (line_start);
		}

		/* Buffer only has part of a line. */
		if (lr->line_start > lr->buff) {
			/* Move a leftover fractional line to the beginning. */
			memmove(lr->buff, lr->line_start,
			    lr->buff_end - lr->line_start);
			lr->buff_end -= lr->line_start - lr->buff;
			lr->line_end -= lr->line_start - lr->buff;
			lr->line_start = lr->buff;
		} else {
			/* Line is too big; enlarge the buffer. */
			new_buff_size = lr->buff_length * 2;
			if (new_buff_size <= lr->buff_length)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_length = new_buff_size;
			/*
			 * Allocate one extra byte to allow terminating
			 * the buffer.
			 */
			p = realloc(lr->buff, new_buff_size + 1);
			if (p == NULL)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_end = p + (lr->buff_end - lr->buff);
			lr->line_end = p + (lr->line_end - lr->buff);
			lr->line_start = lr->buff = p;
		}

		/* Get some more data into the buffer. */
		bytes_wanted = lr->buff + lr->buff_length - lr->buff_end;
		bytes_read = fread(lr->buff_end, 1, bytes_wanted, lr->f);
		lr->buff_end += bytes_read;
		*lr->buff_end = '\0'; /* Always terminate buffer */
		lafe_line_reader_find_eol(lr);

		if (ferror(lr->f))
			lafe_errc(1, errno, "Can't read %s", lr->pathname);
		if (feof(lr->f)) {
			if (lr->f != stdin)
				fclose(lr->f);
			lr->f = NULL;
		}
	}
}